

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WindowRewrite(Parse *pParse,Select *p)

{
  Window *pWin_00;
  long lVar1;
  Select *pParse_00;
  int iVar2;
  Expr *pEVar3;
  SrcList *pSVar4;
  Table *__src;
  undefined4 local_a0;
  int local_9c;
  Table *pTab2;
  Expr *pFilter;
  Table *pTab;
  Window *pWin;
  Window *pMWin;
  ExprList *pSublist;
  ExprList *pSort;
  Expr *pHaving;
  ExprList *pGroupBy;
  Expr *pWhere;
  SrcList *pSrc;
  Select *pSub;
  sqlite3 *db;
  Vdbe *v;
  Select *pSStack_20;
  int rc;
  Select *p_local;
  Parse *pParse_local;
  
  v._4_4_ = 0;
  if ((p->pWin != (Window *)0x0) && (p->pPrior == (Select *)0x0)) {
    pSStack_20 = p;
    p_local = (Select *)pParse;
    db = (sqlite3 *)sqlite3GetVdbe(pParse);
    pSub = (Select *)p_local->pEList;
    pSrc = (SrcList *)0x0;
    pWhere = (Expr *)pSStack_20->pSrc;
    pGroupBy = (ExprList *)pSStack_20->pWhere;
    pHaving = (Expr *)pSStack_20->pGroupBy;
    pSort = (ExprList *)pSStack_20->pHaving;
    pSublist = (ExprList *)0x0;
    pMWin = (Window *)0x0;
    pWin_00 = pSStack_20->pWin;
    pFilter = (Expr *)sqlite3DbMallocZero((sqlite3 *)pSub,0x80);
    if ((Table *)pFilter == (Table *)0x0) {
      return 7;
    }
    pSStack_20->pSrc = (SrcList *)0x0;
    pSStack_20->pWhere = (Expr *)0x0;
    pSStack_20->pGroupBy = (ExprList *)0x0;
    pSStack_20->pHaving = (Expr *)0x0;
    pSStack_20->selFlags = pSStack_20->selFlags & 0xfffffff7;
    pSublist = sqlite3ExprListDup((sqlite3 *)pSub,pWin_00->pPartition,0);
    pSublist = exprListAppendList((Parse *)p_local,pSublist,pWin_00->pOrderBy,1);
    if (((pSublist != (ExprList *)0x0) && (pSStack_20->pOrderBy != (ExprList *)0x0)) &&
       (iVar2 = sqlite3ExprListCompare(pSublist,pSStack_20->pOrderBy,-1), iVar2 == 0)) {
      sqlite3ExprListDelete((sqlite3 *)pSub,pSStack_20->pOrderBy);
      pSStack_20->pOrderBy = (ExprList *)0x0;
    }
    iVar2 = *(int *)((long)&p_local->pWhere + 4);
    *(int *)((long)&p_local->pWhere + 4) = iVar2 + 1;
    pWin_00->iEphCsr = iVar2;
    *(int *)((long)&p_local->pWhere + 4) = *(int *)((long)&p_local->pWhere + 4) + 3;
    selectWindowRewriteEList
              ((Parse *)p_local,pWin_00,(SrcList *)pWhere,pSStack_20->pEList,(Table *)pFilter,
               (ExprList **)&pMWin);
    selectWindowRewriteEList
              ((Parse *)p_local,pWin_00,(SrcList *)pWhere,pSStack_20->pOrderBy,(Table *)pFilter,
               (ExprList **)&pMWin);
    if (pMWin == (Window *)0x0) {
      local_9c = 0;
    }
    else {
      local_9c = *(int *)&pMWin->zName;
    }
    pWin_00->nBufferCol = local_9c;
    pMWin = (Window *)exprListAppendList((Parse *)p_local,(ExprList *)pMWin,pWin_00->pPartition,0);
    pMWin = (Window *)exprListAppendList((Parse *)p_local,(ExprList *)pMWin,pWin_00->pOrderBy,0);
    for (pTab = (Table *)pWin_00; pParse_00 = p_local, pTab != (Table *)0x0;
        pTab = *(Table **)&pTab->tnum) {
      if (pMWin == (Window *)0x0) {
        local_a0 = 0;
      }
      else {
        local_a0 = *(undefined4 *)&pMWin->zName;
      }
      *(undefined4 *)((long)&pTab->pSchema + 4) = local_a0;
      pMWin = (Window *)
              exprListAppendList((Parse *)p_local,(ExprList *)pMWin,
                                 (ExprList *)pTab->pTrigger->pColumns,0);
      lVar1._0_4_ = pTab->tabFlags;
      lVar1._4_2_ = pTab->iPKey;
      lVar1._6_2_ = pTab->nCol;
      if (lVar1 != 0) {
        pEVar3 = sqlite3ExprDup((sqlite3 *)pSub,*(Expr **)&pTab->tabFlags,0);
        pMWin = (Window *)sqlite3ExprListAppend((Parse *)p_local,(ExprList *)pMWin,pEVar3);
      }
      iVar2 = *(int *)&p_local->pGroupBy + 1;
      *(int *)&p_local->pGroupBy = iVar2;
      pTab->nModuleArg = iVar2;
      iVar2 = *(int *)&p_local->pGroupBy + 1;
      *(int *)&p_local->pGroupBy = iVar2;
      *(int *)&pTab->azModuleArg = iVar2;
      sqlite3VdbeAddOp2((Vdbe *)db,0x49,0,pTab->nModuleArg);
    }
    if (pMWin == (Window *)0x0) {
      pEVar3 = sqlite3ExprAlloc((sqlite3 *)pSub,0x93,sqlite3IntTokens,0);
      pMWin = (Window *)sqlite3ExprListAppend((Parse *)pParse_00,(ExprList *)0x0,pEVar3);
    }
    pSrc = (SrcList *)
           sqlite3SelectNew((Parse *)p_local,(ExprList *)pMWin,(SrcList *)pWhere,(Expr *)pGroupBy,
                            (ExprList *)pHaving,(Expr *)pSort,pSublist,0,(Expr *)0x0);
    pSVar4 = sqlite3SrcListAppend((Parse *)p_local,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
    pSStack_20->pSrc = pSVar4;
    if (pSStack_20->pSrc == (SrcList *)0x0) {
      sqlite3SelectDelete((sqlite3 *)pSub,(Select *)pSrc);
    }
    else {
      pSStack_20->pSrc->a[0].pSelect = (Select *)pSrc;
      sqlite3SrcListAssignCursors((Parse *)p_local,pSStack_20->pSrc);
      *(uint *)((long)&pSrc->a[0].pSchema + 4) = *(uint *)((long)&pSrc->a[0].pSchema + 4) | 0x40;
      __src = sqlite3ResultSetOfSelect((Parse *)p_local,(Select *)pSrc);
      if (__src == (Table *)0x0) {
        v._4_4_ = 7;
      }
      else {
        memcpy(pFilter,__src,0x80);
        ((Table *)pFilter)->tabFlags = ((Table *)pFilter)->tabFlags | 2;
        pSStack_20->pSrc->a[0].pTab = (Table *)pFilter;
        pFilter = (Expr *)__src;
      }
      sqlite3VdbeAddOp2((Vdbe *)db,0x71,pWin_00->iEphCsr,*(int *)&pMWin->zName);
      sqlite3VdbeAddOp2((Vdbe *)db,0x6f,pWin_00->iEphCsr + 1,pWin_00->iEphCsr);
      sqlite3VdbeAddOp2((Vdbe *)db,0x6f,pWin_00->iEphCsr + 2,pWin_00->iEphCsr);
      sqlite3VdbeAddOp2((Vdbe *)db,0x6f,pWin_00->iEphCsr + 3,pWin_00->iEphCsr);
    }
    if (*(char *)((long)&pSub->pLimit + 1) != '\0') {
      v._4_4_ = 7;
    }
    sqlite3DbFree((sqlite3 *)pSub,pFilter);
  }
  return v._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowRewrite(Parse *pParse, Select *p){
  int rc = SQLITE_OK;
  if( p->pWin && p->pPrior==0 ){
    Vdbe *v = sqlite3GetVdbe(pParse);
    sqlite3 *db = pParse->db;
    Select *pSub = 0;             /* The subquery */
    SrcList *pSrc = p->pSrc;
    Expr *pWhere = p->pWhere;
    ExprList *pGroupBy = p->pGroupBy;
    Expr *pHaving = p->pHaving;
    ExprList *pSort = 0;

    ExprList *pSublist = 0;       /* Expression list for sub-query */
    Window *pMWin = p->pWin;      /* Master window object */
    Window *pWin;                 /* Window object iterator */
    Table *pTab;

    pTab = sqlite3DbMallocZero(db, sizeof(Table));
    if( pTab==0 ){
      return SQLITE_NOMEM;
    }

    p->pSrc = 0;
    p->pWhere = 0;
    p->pGroupBy = 0;
    p->pHaving = 0;
    p->selFlags &= ~SF_Aggregate;

    /* Create the ORDER BY clause for the sub-select. This is the concatenation
    ** of the window PARTITION and ORDER BY clauses. Then, if this makes it
    ** redundant, remove the ORDER BY from the parent SELECT.  */
    pSort = sqlite3ExprListDup(db, pMWin->pPartition, 0);
    pSort = exprListAppendList(pParse, pSort, pMWin->pOrderBy, 1);
    if( pSort && p->pOrderBy ){
      if( sqlite3ExprListCompare(pSort, p->pOrderBy, -1)==0 ){
        sqlite3ExprListDelete(db, p->pOrderBy);
        p->pOrderBy = 0;
      }
    }

    /* Assign a cursor number for the ephemeral table used to buffer rows.
    ** The OpenEphemeral instruction is coded later, after it is known how
    ** many columns the table will have.  */
    pMWin->iEphCsr = pParse->nTab++;
    pParse->nTab += 3;

    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pEList, pTab, &pSublist);
    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pOrderBy, pTab, &pSublist);
    pMWin->nBufferCol = (pSublist ? pSublist->nExpr : 0);

    /* Append the PARTITION BY and ORDER BY expressions to the to the 
    ** sub-select expression list. They are required to figure out where 
    ** boundaries for partitions and sets of peer rows lie.  */
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pPartition, 0);
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pOrderBy, 0);

    /* Append the arguments passed to each window function to the
    ** sub-select expression list. Also allocate two registers for each
    ** window function - one for the accumulator, another for interim
    ** results.  */
    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      pWin->iArgCol = (pSublist ? pSublist->nExpr : 0);
      pSublist = exprListAppendList(pParse, pSublist, pWin->pOwner->x.pList, 0);
      if( pWin->pFilter ){
        Expr *pFilter = sqlite3ExprDup(db, pWin->pFilter, 0);
        pSublist = sqlite3ExprListAppend(pParse, pSublist, pFilter);
      }
      pWin->regAccum = ++pParse->nMem;
      pWin->regResult = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
    }

    /* If there is no ORDER BY or PARTITION BY clause, and the window
    ** function accepts zero arguments, and there are no other columns
    ** selected (e.g. "SELECT row_number() OVER () FROM t1"), it is possible
    ** that pSublist is still NULL here. Add a constant expression here to 
    ** keep everything legal in this case. 
    */
    if( pSublist==0 ){
      pSublist = sqlite3ExprListAppend(pParse, 0, 
          sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0)
      );
    }

    pSub = sqlite3SelectNew(
        pParse, pSublist, pSrc, pWhere, pGroupBy, pHaving, pSort, 0, 0
    );
    p->pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( p->pSrc ){
      Table *pTab2;
      p->pSrc->a[0].pSelect = pSub;
      sqlite3SrcListAssignCursors(pParse, p->pSrc);
      pSub->selFlags |= SF_Expanded;
      pTab2 = sqlite3ResultSetOfSelect(pParse, pSub);
      if( pTab2==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memcpy(pTab, pTab2, sizeof(Table));
        pTab->tabFlags |= TF_Ephemeral;
        p->pSrc->a[0].pTab = pTab;
        pTab = pTab2;
      }
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pMWin->iEphCsr, pSublist->nExpr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+1, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+2, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+3, pMWin->iEphCsr);
    }else{
      sqlite3SelectDelete(db, pSub);
    }
    if( db->mallocFailed ) rc = SQLITE_NOMEM;
    sqlite3DbFree(db, pTab);
  }

  return rc;
}